

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_bounding_sphere_xyz(REF_DBL *xyz,REF_INT n,REF_DBL *center,REF_DBL *radius)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  lVar1 = 0;
  do {
    while (center[lVar1] = 0.0, n < 1) {
      center[lVar1] = 0.0 / (double)n;
      lVar1 = lVar1 + 1;
      if (lVar1 == 3) {
        *radius = 0.0;
        return 0;
      }
    }
    dVar4 = 0.0;
    lVar2 = 0;
    do {
      dVar4 = dVar4 + *(double *)((long)xyz + lVar2 + lVar1 * 8);
      center[lVar1] = dVar4;
      lVar2 = lVar2 + 0x18;
    } while ((ulong)(uint)n * 0x18 != lVar2);
    center[lVar1] = dVar4 / (double)n;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  *radius = 0.0;
  if (n < 1) {
    return 0;
  }
  dVar4 = 0.0;
  lVar1 = 0;
  do {
    dVar3 = *(double *)((long)xyz + lVar1 + 8) - center[1];
    dVar5 = *(double *)((long)xyz + lVar1) - *center;
    dVar6 = *(double *)((long)xyz + lVar1 + 0x10) - center[2];
    dVar3 = SQRT(dVar6 * dVar6 + dVar3 * dVar3 + dVar5 * dVar5);
    if (dVar4 <= dVar3) {
      dVar4 = dVar3;
    }
    *radius = dVar4;
    lVar1 = lVar1 + 0x18;
  } while ((ulong)(uint)n * 0x18 != lVar1);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_sphere_xyz(REF_DBL *xyz, REF_INT n,
                                                REF_DBL *center,
                                                REF_DBL *radius) {
  REF_INT i, j;
  for (i = 0; i < 3; i++) {
    center[i] = 0;
    for (j = 0; j < n; j++) {
      center[i] += xyz[i + 3 * j];
    }
    center[i] /= (REF_DBL)n;
  }
  *radius = 0.0;
  for (i = 0; i < n; i++)
    *radius = MAX(*radius, sqrt(pow(xyz[0 + 3 * i] - center[0], 2) +
                                pow(xyz[1 + 3 * i] - center[1], 2) +
                                pow(xyz[2 + 3 * i] - center[2], 2)));
  return REF_SUCCESS;
}